

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

Value __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::makeNumberCheck
          (Interpreter *this,LocationRange *loc,double v)

{
  RuntimeError *pRVar1;
  Value VVar2;
  string local_48;
  
  if (NAN(v)) {
    pRVar1 = (RuntimeError *)__cxa_allocate_exception(0x38);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"not a number","");
    Stack::makeError(pRVar1,&this->stack,loc,&local_48);
    __cxa_throw(pRVar1,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  if (ABS(v) != INFINITY) {
    VVar2.v.d = INFINITY;
    VVar2._0_8_ = v;
    return VVar2;
  }
  pRVar1 = (RuntimeError *)__cxa_allocate_exception(0x38);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"overflow","");
  Stack::makeError(pRVar1,&this->stack,loc,&local_48);
  __cxa_throw(pRVar1,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

Value makeNumberCheck(const LocationRange &loc, double v)
    {
        if (std::isnan(v)) {
            throw makeError(loc, "not a number");
        }
        if (std::isinf(v)) {
            throw makeError(loc, "overflow");
        }
        return makeNumber(v);
    }